

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib_base.c
# Opt level: O3

void lj_ffh_coroutine_wrap_err(lua_State *L,lua_State *co)

{
  TValue *pTVar1;
  anon_struct_8_2_7fa0a05d_for_TValue_4 aVar2;
  
  pTVar1 = co->top;
  co->top = pTVar1 + -1;
  *L->top = pTVar1[-1];
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  aVar2 = pTVar1->field_4;
  if (aVar2.it >> 0xf == 0x1fffb) {
    lj_err_callermsg(L,(char *)(((ulong)aVar2 & 0x7fffffffffff) + 0x18));
  }
  lj_err_run(L);
}

Assistant:

void LJ_FASTCALL lj_ffh_coroutine_wrap_err(lua_State *L, lua_State *co)
{
  co->top--; copyTV(L, L->top, co->top); L->top++;
  if (tvisstr(L->top-1))
    lj_err_callermsg(L, strVdata(L->top-1));
  else
    lj_err_run(L);
}